

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_os.c
# Opt level: O0

int lj_cf_os_tmpname(lua_State *L)

{
  int __fd;
  lua_State *in_RDI;
  int fp;
  char buf [16];
  ErrMsg in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  char local_18 [8];
  char *in_stack_fffffffffffffff0;
  
  strcpy(local_18,"/tmp/lua_XXXXXX");
  __fd = mkstemp64(local_18);
  if (__fd != -1) {
    close(__fd);
    lua_pushstring(in_RDI,in_stack_fffffffffffffff0);
    return 1;
  }
  lj_err_caller((lua_State *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc);
}

Assistant:

LJLIB_CF(os_tmpname)
{
#if LJ_TARGET_PS3 || LJ_TARGET_PS4 || LJ_TARGET_PSVITA
  lj_err_caller(L, LJ_ERR_OSUNIQF);
  return 0;
#else
#if LJ_TARGET_POSIX
  char buf[15+1];
  int fp;
  strcpy(buf, "/tmp/lua_XXXXXX");
  fp = mkstemp(buf);
  if (fp != -1)
    close(fp);
  else
    lj_err_caller(L, LJ_ERR_OSUNIQF);
#else
  char buf[L_tmpnam];
  if (tmpnam(buf) == NULL)
    lj_err_caller(L, LJ_ERR_OSUNIQF);
#endif
  lua_pushstring(L, buf);
  return 1;
#endif
}